

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QModelIndexList * __thiscall QListView::selectedIndexes(QListView *this)

{
  long lVar1;
  anon_class_16_2_fd512dd1_for__M_pred pred;
  bool bVar2;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  QModelIndexList *viewSelected;
  anon_class_16_2_fd512dd1_for__M_pred ignorable;
  QList<QModelIndex> *in_stack_ffffffffffffff98;
  QListViewPrivate *pQVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  d_func((QListView *)0x87eacc);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x87eae2);
  if (bVar2) {
    *(undefined1 **)
     &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
      super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
      super_QWidgetPrivate.field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
      super_QWidgetPrivate.field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x87eb41);
    QItemSelectionModel::selectedIndexes();
    pred.d = pQVar3;
    pred.this = (QListView *)in_RDI;
    QList<QModelIndex>::removeIf<QListView::selectedIndexes()const::__0>
              (in_stack_ffffffffffffff98,pred);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x87eb01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QModelIndexList *)pQVar3;
}

Assistant:

QModelIndexList QListView::selectedIndexes() const
{
    Q_D(const QListView);
    if (!d->selectionModel)
        return QModelIndexList();

    QModelIndexList viewSelected = d->selectionModel->selectedIndexes();
    auto ignorable = [this, d](const QModelIndex &index) {
        return index.column() != d->column || index.parent() != d->root || isIndexHidden(index);
    };
    viewSelected.removeIf(ignorable);
    return viewSelected;
}